

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collection.cpp
# Opt level: O1

bool arangodb::velocypack::Collection::contains(Slice slice,Predicate *predicate)

{
  ValueLength VVar1;
  ValueLength VVar2;
  bool bVar3;
  unsigned_long uVar4;
  Slice s;
  ArrayIterator it;
  Slice local_60;
  unsigned_long local_58;
  ArrayIterator local_50;
  
  ArrayIterator::ArrayIterator(&local_50,slice);
  uVar4 = 0;
  while (VVar2 = local_50._position, VVar1 = local_50._size, local_50._position != local_50._size) {
    local_60 = ArrayIterator::value(&local_50);
    local_58 = uVar4;
    if ((predicate->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    bVar3 = (*predicate->_M_invoker)((_Any_data *)predicate,&local_60,&local_58);
    if (bVar3) break;
    ArrayIterator::next(&local_50);
    uVar4 = uVar4 + 1;
  }
  return VVar2 != VVar1;
}

Assistant:

bool Collection::contains(Slice slice, Predicate const& predicate) {
  ArrayIterator it(slice);
  ValueLength index = 0;

  while (it.valid()) {
    Slice s = it.value();
    if (predicate(s, index)) {
      return true;
    }
    it.next();
    ++index;
  }

  return false;
}